

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SpecifyWithLengthCase::iterate
          (SpecifyWithLengthCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  TestLog *pTVar3;
  bool bVar4;
  int iVar5;
  deBool dVar6;
  undefined4 extraout_var;
  undefined8 *puVar8;
  long *plVar9;
  size_t sVar10;
  NotSupportedError *this_00;
  size_type *psVar11;
  undefined8 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int outlen;
  ScopedLogSection section;
  ResultCollector result;
  char buffer [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  undefined8 local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  string local_2b0;
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  int local_270;
  undefined4 local_26c;
  ScopedLogSection local_268;
  undefined8 local_260;
  code *local_258;
  int local_250;
  undefined1 local_248 [112];
  ios_base local_1d8 [8];
  ios_base local_1d0 [264];
  ResultCollector local_c8;
  char local_78 [60];
  uint uStack_3c;
  long lVar7;
  
  bVar4 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar4) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x806);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_248 + 0x10);
  local_248._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_c8,pTVar3,(string *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != paVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  local_270 = -1;
  local_260 = (**(code **)(lVar7 + 0x640))(0x9117,0);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_0037407b;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_0037407b:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar15) {
      local_2e0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar15;
    puVar8[1] = 0;
    paVar15->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar15) {
      local_248._16_8_ = paVar15->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar15->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  local_26c = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_003742d1;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_003742d1:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar15) {
      local_2e0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar15;
    puVar8[1] = 0;
    paVar15->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar15) {
      local_248._16_8_ = paVar15->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar15->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Shader","");
  paVar15 = &local_2d0.field_2;
  local_2d0._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_268,pTVar3,(string *)local_248,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar15) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != paVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_248 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"This is a debug label",0x15)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\" with length 12",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1d0);
  (**(code **)(lVar7 + 0xfc0))(0x82e1,local_26c,0xc,"This is a debug label");
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_00374657;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_00374657:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_248 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Querying label",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1d0);
  builtin_strncpy(local_78,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_3c = 0x58585858;
  (**(code **)(lVar7 + 0x958))(0x82e1,local_26c,0x40,&local_270);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_00374939;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_00374939:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_270 == 0xc) {
    dVar6 = deStringEqual("This is a de",local_78);
    if (dVar6 == 0) {
      uStack_3c = uStack_3c & 0xffffff;
      local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_248 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Query returned wrong string: expected \"",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"This is a de",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\" but got \"",0xb);
      sVar10 = strlen(local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,local_78,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1d0);
      local_248._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"Query returned wrong label","");
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      uVar12 = local_248._16_8_;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != paVar1) goto LAB_00374dad;
    }
    else {
      local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_248 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Query returned string: \"",0x18);
      sVar10 = strlen(local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,local_78,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1d0);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    std::ostream::operator<<(local_248,local_270);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    std::ios_base::~ios_base(local_1d8);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x942274);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2e0._M_allocated_capacity;
    paVar13 = local_2f0;
    if (local_2f0 != &local_2e0) {
LAB_00374dad:
      operator_delete(paVar13,uVar12 + 1);
    }
  }
  tcu::TestLog::endSection(local_268.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Sync","");
  local_2d0._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_268,pTVar3,(string *)local_248,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar15) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != paVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_248 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"This is a debug label",0x15)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\" with length 12",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1d0);
  (**(code **)(lVar7 + 0xfc8))(local_260,0xc,"This is a debug label");
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_00374f90;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_00374f90:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_248 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Querying label",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1d0);
  builtin_strncpy(local_78,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_3c = 0x58585858;
  (**(code **)(lVar7 + 0x960))(local_260,0x40,&local_270);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_0037526a;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_0037526a:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_270 == 0xc) {
    dVar6 = deStringEqual("This is a de",local_78);
    if (dVar6 == 0) {
      uStack_3c = uStack_3c & 0xffffff;
      local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_248 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Query returned wrong string: expected \"",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"This is a de",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\" but got \"",0xb);
      sVar10 = strlen(local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,local_78,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1d0);
      local_248._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"Query returned wrong label","");
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      uVar12 = local_248._16_8_;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != paVar1) goto LAB_003756de;
    }
    else {
      local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_248 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Query returned string: \"",0x18);
      sVar10 = strlen(local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,local_78,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1d0);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    std::ostream::operator<<(local_248,local_270);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    std::ios_base::~ios_base(local_1d8);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x942274);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2e0._M_allocated_capacity;
    paVar13 = local_2f0;
    if (local_2f0 != &local_2e0) {
LAB_003756de:
      operator_delete(paVar13,uVar12 + 1);
    }
  }
  tcu::TestLog::endSection(local_268.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"ZeroSized","");
  local_2d0._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"ZeroSized","");
  tcu::ScopedLogSection::ScopedLogSection(&local_268,pTVar3,(string *)local_248,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar15) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != paVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_248 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"This is a debug label",0x15)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\" with length 0",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1d0);
  (**(code **)(lVar7 + 0xfc0))(0x82e1,local_26c,0,"This is a debug label");
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_003758c2;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_003758c2:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_248 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Querying label",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1d0);
  builtin_strncpy(local_78,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_3c = 0x58585858;
  (**(code **)(lVar7 + 0x958))(0x82e1,local_26c,0x40,&local_270);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  if (iVar5 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_258);
    uVar14 = 0xf;
    if (local_290 != local_280) {
      uVar14 = local_280[0];
    }
    if (uVar14 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_00375ba4;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_00375ba4:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e0._8_8_ = puVar8[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    local_2e8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._24_8_ = puVar8[3];
      local_248._0_8_ = paVar1;
    }
    else {
      local_248._16_8_ = paVar13->_M_allocated_capacity;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_248._8_8_ = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != paVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_270 == 0) {
    if (local_78[0] == '\0') {
      local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_248 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Got 0-sized null-terminated string.",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1d0);
      goto LAB_00375f0c;
    }
    local_248._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"label was not null terminated","");
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    uVar12 = local_248._16_8_;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ == paVar1) goto LAB_00375f0c;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    std::ostream::operator<<(local_248,local_270);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    std::ios_base::~ios_base(local_1d8);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x94210e);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0.field_2._8_8_ = plVar9[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar11;
      local_2d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar15) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2e0._M_allocated_capacity;
    paVar15 = local_2f0;
    if (local_2f0 == &local_2e0) goto LAB_00375f0c;
  }
  operator_delete(paVar15,uVar12 + 1);
LAB_00375f0c:
  tcu::TestLog::endSection(local_268.m_log);
  (**(code **)(lVar7 + 0x470))(local_26c);
  (**(code **)(lVar7 + 0x478))(local_260);
  tcu::ResultCollector::setTestContextResult
            (&local_c8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_prefix._M_dataplus._M_p != &local_c8.m_prefix.field_2) {
    operator_delete(local_c8.m_prefix._M_dataplus._M_p,
                    local_c8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

SpecifyWithLengthCase::IterateResult SpecifyWithLengthCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	const char*	const		clipMsg		= "This is a de";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 12" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, 12, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 12)
			result.fail("'length' was not 12, got " + de::toString(outlen));
		else if (deStringEqual(clipMsg, buffer))
		{
			m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		else
		{
			buffer[63] = '\0'; // make sure buffer is null terminated before printing
			m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << clipMsg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
			result.fail("Query returned wrong label");
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 12" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, 12, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 12)
			result.fail("'length' was not 12, got " + de::toString(outlen));
		else if (deStringEqual(clipMsg, buffer))
		{
			m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		else
		{
			buffer[63] = '\0'; // make sure buffer is null terminated before printing
			m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << clipMsg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
			result.fail("Query returned wrong label");
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ZeroSized", "ZeroSized");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 0" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, 0, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}